

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

void act_var_rescale(sat_solver3 *s)

{
  int iVar1;
  word *pwVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  word wVar6;
  ulong uVar7;
  
  iVar1 = s->VarActType;
  if (iVar1 == 2) {
    uVar3 = 0x800000000000;
    iVar1 = s->size;
    if (0 < (long)iVar1) {
      pwVar2 = s->activity;
      lVar5 = 0;
      do {
        uVar4 = pwVar2[lVar5];
        wVar6 = 0x800000000000;
        if (0xc7ffffffffffff < uVar4) {
          if (((uVar4 & 0x800000000000) == 0) || (uVar7 = (uVar4 >> 0x30) - 200, 0xffff < uVar7))
          goto LAB_008f7d65;
          wVar6 = uVar7 << 0x30 | uVar4 & 0xffffffffffff;
        }
        pwVar2[lVar5] = wVar6;
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    uVar4 = s->var_inc;
    if (0xc7ffffffffffff < uVar4) {
      if (((uVar4 & 0x800000000000) == 0) || (uVar3 = (uVar4 >> 0x30) - 200, 0xffff < uVar3)) {
LAB_008f7d65:
        __assert_fail("!(Exp>>16) && (Mnt>>47)==(word)1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilDouble.h"
                      ,0x36,"xdbl Xdbl_Create(word, word)");
      }
      uVar3 = uVar3 << 0x30 | uVar4 & 0xffffffffffff;
    }
    s->var_inc = uVar3;
  }
  else if (iVar1 == 1) {
    iVar1 = s->size;
    if (0 < (long)iVar1) {
      pwVar2 = s->activity;
      lVar5 = 0;
      do {
        pwVar2[lVar5] = (word)((double)pwVar2[lVar5] * 1e-100);
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    s->var_inc = (word)((double)s->var_inc * 1e-100);
  }
  else {
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x129,"void act_var_rescale(sat_solver3 *)");
    }
    iVar1 = s->size;
    if (0 < (long)iVar1) {
      pwVar2 = s->activity;
      lVar5 = 0;
      do {
        pwVar2[lVar5] = pwVar2[lVar5] >> 0x13;
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
    }
    uVar3 = s->var_inc >> 0x13;
    uVar4 = 0x10;
    if (0x10 < (int)uVar3) {
      uVar4 = uVar3 & 0xffffffff;
    }
    s->var_inc = uVar4;
  }
  return;
}

Assistant:

static inline void act_var_rescale(sat_solver3* s)  
{
    if ( s->VarActType == 0 )
    {
        word* activity = s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] >>= 19;
        s->var_inc >>= 19;
        s->var_inc = Abc_MaxInt( (unsigned)s->var_inc, (1<<4) );
    }
    else if ( s->VarActType == 1 )
    {
        double* activity = (double*)s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] *= 1e-100;
        s->var_inc = Abc_Dbl2Word( Abc_Word2Dbl(s->var_inc) * 1e-100 );
        //printf( "Rescaling var activity...\n" ); 
    }
    else if ( s->VarActType == 2 )
    {
        xdbl * activity = s->activity;
        int i;
        for (i = 0; i < s->size; i++)
            activity[i] = Xdbl_Div( activity[i], 200 ); // activity[i] / 2^200
        s->var_inc = Xdbl_Div( s->var_inc, 200 ); 
    }
    else assert(0);
}